

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O0

int __thiscall cmCTestUpdateHandler::DetectVCS(cmCTestUpdateHandler *this,string *dir)

{
  cmCTest *this_00;
  bool bVar1;
  ostream *poVar2;
  char *msg;
  cmAlphaNum local_4f0;
  cmAlphaNum local_4c0;
  string local_490;
  cmAlphaNum local_470;
  cmAlphaNum local_440;
  string local_410;
  cmAlphaNum local_3f0;
  cmAlphaNum local_3c0;
  string local_390;
  cmAlphaNum local_370;
  cmAlphaNum local_340;
  string local_310;
  cmAlphaNum local_2f0;
  cmAlphaNum local_2c0;
  string local_290;
  cmAlphaNum local_270;
  cmAlphaNum local_240;
  string local_210;
  undefined4 local_1ec;
  string local_1e8 [48];
  undefined1 local_1b8 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_40 [8];
  string sourceDirectory;
  string *dir_local;
  cmCTestUpdateHandler *this_local;
  
  sourceDirectory.field_2._8_8_ = dir;
  std::__cxx11::string::string((string *)local_40,(string *)dir);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  poVar2 = std::operator<<((ostream *)local_1b8,"Check directory: ");
  poVar2 = std::operator<<(poVar2,(string *)local_40);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  msg = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(this_00,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
               ,0x10a,msg,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::__cxx11::string::operator+=((string *)local_40,"/.svn");
  bVar1 = cmsys::SystemTools::FileExists((string *)local_40);
  if (bVar1) {
    this_local._4_4_ = 2;
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_240,(string *)sourceDirectory.field_2._8_8_);
    cmAlphaNum::cmAlphaNum(&local_270,"/CVS");
    cmStrCat<>(&local_210,&local_240,&local_270);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    bVar1 = cmsys::SystemTools::FileExists((string *)local_40);
    if (bVar1) {
      this_local._4_4_ = 1;
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_2c0,(string *)sourceDirectory.field_2._8_8_);
      cmAlphaNum::cmAlphaNum(&local_2f0,"/.bzr");
      cmStrCat<>(&local_290,&local_2c0,&local_2f0);
      std::__cxx11::string::operator=((string *)local_40,(string *)&local_290);
      std::__cxx11::string::~string((string *)&local_290);
      bVar1 = cmsys::SystemTools::FileExists((string *)local_40);
      if (bVar1) {
        this_local._4_4_ = 3;
      }
      else {
        cmAlphaNum::cmAlphaNum(&local_340,(string *)sourceDirectory.field_2._8_8_);
        cmAlphaNum::cmAlphaNum(&local_370,"/.git");
        cmStrCat<>(&local_310,&local_340,&local_370);
        std::__cxx11::string::operator=((string *)local_40,(string *)&local_310);
        std::__cxx11::string::~string((string *)&local_310);
        bVar1 = cmsys::SystemTools::FileExists((string *)local_40);
        if (bVar1) {
          this_local._4_4_ = 4;
        }
        else {
          cmAlphaNum::cmAlphaNum(&local_3c0,(string *)sourceDirectory.field_2._8_8_);
          cmAlphaNum::cmAlphaNum(&local_3f0,"/.hg");
          cmStrCat<>(&local_390,&local_3c0,&local_3f0);
          std::__cxx11::string::operator=((string *)local_40,(string *)&local_390);
          std::__cxx11::string::~string((string *)&local_390);
          bVar1 = cmsys::SystemTools::FileExists((string *)local_40);
          if (bVar1) {
            this_local._4_4_ = 5;
          }
          else {
            cmAlphaNum::cmAlphaNum(&local_440,(string *)sourceDirectory.field_2._8_8_);
            cmAlphaNum::cmAlphaNum(&local_470,"/.p4");
            cmStrCat<>(&local_410,&local_440,&local_470);
            std::__cxx11::string::operator=((string *)local_40,(string *)&local_410);
            std::__cxx11::string::~string((string *)&local_410);
            bVar1 = cmsys::SystemTools::FileExists((string *)local_40);
            if (bVar1) {
              this_local._4_4_ = 6;
            }
            else {
              cmAlphaNum::cmAlphaNum(&local_4c0,(string *)sourceDirectory.field_2._8_8_);
              cmAlphaNum::cmAlphaNum(&local_4f0,"/.p4config");
              cmStrCat<>(&local_490,&local_4c0,&local_4f0);
              std::__cxx11::string::operator=((string *)local_40,(string *)&local_490);
              std::__cxx11::string::~string((string *)&local_490);
              bVar1 = cmsys::SystemTools::FileExists((string *)local_40);
              if (bVar1) {
                this_local._4_4_ = 6;
              }
              else {
                this_local._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  local_1ec = 1;
  std::__cxx11::string::~string((string *)local_40);
  return this_local._4_4_;
}

Assistant:

int cmCTestUpdateHandler::DetectVCS(const std::string& dir)
{
  std::string sourceDirectory = dir;
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "Check directory: " << sourceDirectory << std::endl,
                     this->Quiet);
  sourceDirectory += "/.svn";
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_SVN;
  }
  sourceDirectory = cmStrCat(dir, "/CVS");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_CVS;
  }
  sourceDirectory = cmStrCat(dir, "/.bzr");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_BZR;
  }
  sourceDirectory = cmStrCat(dir, "/.git");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_GIT;
  }
  sourceDirectory = cmStrCat(dir, "/.hg");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_HG;
  }
  sourceDirectory = cmStrCat(dir, "/.p4");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_P4;
  }
  sourceDirectory = cmStrCat(dir, "/.p4config");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_P4;
  }
  return cmCTestUpdateHandler::e_UNKNOWN;
}